

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Appearance_PDU::SetAppearanceEMFlag(Appearance_PDU *this,KBOOL F)

{
  KUINT16 *pKVar1;
  undefined2 uVar2;
  KUINT16 KVar3;
  
  if ((KBOOL)((this->m_AppearanceFlag2Union).m_ui8Flag & 1) != F) {
    (this->m_AppearanceFlag2Union).m_ui8Flag = (this->m_AppearanceFlag2Union).m_ui8Flag & 0xfe | F;
    if (F) {
      if ((char)(this->m_AppearanceFlag1Union).m_ui8Flag < '\0') {
        KVar3 = (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
      }
      else {
        (this->m_AppearanceFlag1Union).m_ui8Flag = (this->m_AppearanceFlag1Union).m_ui8Flag | 0x80;
        uVar2 = (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
        KVar3 = uVar2 + 1;
      }
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar3 + 4;
      return;
    }
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 - 4;
  }
  return;
}

Assistant:

void Appearance_PDU::SetAppearanceEMFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag2Union.m_ui8EM )return;

    m_AppearanceFlag2Union.m_ui8EM = F;

    if( F )
    {
        SetFlag2Flag( F );
        m_ui16PDULength += EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
}